

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_ul_setup(connectdata *conn,_Bool sizechecked)

{
  SessionHandle *data;
  void *pvVar1;
  long lVar2;
  int iVar3;
  CURLcode CVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  curl_off_t cVar9;
  long lVar10;
  
  data = conn->data;
  pvVar1 = (data->req).protop;
  lVar10 = (data->state).resume_from;
  if (lVar10 == 0 || sizechecked) {
    if (lVar10 < 1 || !sizechecked) goto LAB_0012fe00;
  }
  else if (lVar10 < 0) {
    CVar4 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"SIZE %s",(conn->proto).ftpc.file);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    (conn->proto).ftpc.state = FTP_STOR_SIZE;
    return CURLE_OK;
  }
  (data->set).ftp_append = true;
  if ((conn->seek_func != (curl_seek_callback)0x0) &&
     (iVar3 = (*conn->seek_func)(conn->seek_client,lVar10,0), iVar3 != 0)) {
    if (iVar3 != 2) {
      pcVar8 = "Could not seek stream";
LAB_0012febb:
      Curl_failf(data,pcVar8);
      return CURLE_FTP_COULDNT_USE_REST;
    }
    cVar9 = (data->state).resume_from;
    lVar10 = 0;
    do {
      sVar7 = 0x4000;
      if (cVar9 - lVar10 < 0x4001) {
        sVar7 = curlx_sotouz(cVar9 - lVar10);
      }
      sVar5 = (*conn->fread_func)((data->state).buffer,1,sVar7,conn->fread_in);
      if (sVar7 <= sVar5 - 1) {
        pcVar8 = "Failed to read data";
        goto LAB_0012febb;
      }
      lVar10 = lVar10 + sVar5;
      cVar9 = (data->state).resume_from;
    } while (lVar10 < cVar9);
  }
  lVar10 = (data->state).infilesize;
  if ((0 < lVar10) &&
     (lVar2 = (data->state).resume_from, lVar6 = lVar10 - lVar2, (data->state).infilesize = lVar6,
     lVar6 == 0 || lVar10 < lVar2)) {
    Curl_infof(data,"File already completely uploaded\n");
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
    *(undefined4 *)((long)pvVar1 + 0x18) = 2;
    (conn->proto).ftpc.state = FTP_STOP;
    return CURLE_OK;
  }
LAB_0012fe00:
  pcVar8 = "STOR %s";
  if ((data->set).ftp_append != false) {
    pcVar8 = "APPE %s";
  }
  CVar4 = Curl_pp_sendf(&(conn->proto).ftpc.pp,pcVar8,(conn->proto).ftpc.file);
  if (CVar4 == CURLE_OK) {
    (conn->proto).ftpc.state = FTP_STOR;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_ul_setup(struct connectdata *conn,
                                   bool sizechecked)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct SessionHandle *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  int seekerr = CURL_SEEKFUNC_OK;

  if((data->state.resume_from && !sizechecked) ||
     ((data->state.resume_from > 0) && sizechecked)) {
    /* we're about to continue the uploading of a file */
    /* 1. get already existing file's size. We use the SIZE command for this
       which may not exist in the server!  The SIZE command is not in
       RFC959. */

    /* 2. This used to set REST. But since we can do append, we
       don't another ftp command. We just skip the source file
       offset and then we APPEND the rest on the file instead */

    /* 3. pass file-size number of bytes in the source file */
    /* 4. lower the infilesize counter */
    /* => transfer as usual */

    if(data->state.resume_from < 0 ) {
      /* Got no given size to start from, figure it out */
      PPSENDF(&ftpc->pp, "SIZE %s", ftpc->file);
      state(conn, FTP_STOR_SIZE);
      return result;
    }

    /* enable append */
    data->set.ftp_append = TRUE;

    /* Let's read off the proper amount of bytes from the input. */
    if(conn->seek_func) {
      seekerr = conn->seek_func(conn->seek_client, data->state.resume_from,
                                SEEK_SET);
    }

    if(seekerr != CURL_SEEKFUNC_OK) {
      if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
        failf(data, "Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      /* seekerr == CURL_SEEKFUNC_CANTSEEK (can't seek to offset) */
      else {
        curl_off_t passed=0;
        do {
          size_t readthisamountnow =
            (data->state.resume_from - passed > CURL_OFF_T_C(BUFSIZE)) ?
            BUFSIZE : curlx_sotouz(data->state.resume_from - passed);

          size_t actuallyread =
            conn->fread_func(data->state.buffer, 1, readthisamountnow,
                             conn->fread_in);

          passed += actuallyread;
          if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
            /* this checks for greater-than only to make sure that the
               CURL_READFUNC_ABORT return code still aborts */
            failf(data, "Failed to read data");
            return CURLE_FTP_COULDNT_USE_REST;
          }
        } while(passed < data->state.resume_from);
      }
    }
    /* now, decrease the size of the read */
    if(data->state.infilesize>0) {
      data->state.infilesize -= data->state.resume_from;

      if(data->state.infilesize <= 0) {
        infof(data, "File already completely uploaded\n");

        /* no data to transfer */
        Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

        /* Set ->transfer so that we won't get any error in
         * ftp_done() because we didn't transfer anything! */
        ftp->transfer = FTPTRANSFER_NONE;

        state(conn, FTP_STOP);
        return CURLE_OK;
      }
    }
    /* we've passed, proceed as normal */
  } /* resume_from */

  PPSENDF(&ftpc->pp, data->set.ftp_append?"APPE %s":"STOR %s",
          ftpc->file);

  state(conn, FTP_STOR);

  return result;
}